

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O1

double calcScore(int *bins,int bincount,int keycount)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 extraout_var [56];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 in_XMM3_Qa;
  double dVar6;
  undefined1 auVar7 [16];
  
  auVar3 = ZEXT864(0) << 0x40;
  auVar4 = auVar3._0_16_;
  if (0 < bincount) {
    uVar1 = 0;
    do {
      auVar4._0_8_ = (double)bins[uVar1];
      auVar4._8_8_ = in_XMM3_Qa;
      auVar4 = vfmadd231sd_fma(auVar3._0_16_,auVar4,auVar4);
      auVar3 = ZEXT1664(auVar4);
      uVar1 = uVar1 + 1;
    } while ((uint)bincount != uVar1);
  }
  auVar7._0_8_ = (double)keycount;
  auVar7._8_8_ = in_XMM3_Qa;
  dVar6 = (double)bincount;
  auVar2._0_8_ = auVar4._0_8_ / dVar6;
  auVar2._8_8_ = auVar4._8_8_;
  if (auVar2._0_8_ < 0.0) {
    auVar3._0_8_ = sqrt(auVar2._0_8_);
    auVar3._8_56_ = extraout_var;
    auVar4 = auVar3._0_16_;
    auVar7._8_8_ = 0;
  }
  else {
    auVar4 = vsqrtsd_avx(auVar2,auVar2);
  }
  auVar2 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar7,auVar7);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = auVar4._0_8_ * dVar6;
  auVar4 = vfmsub213sd_fma(auVar5,auVar4,auVar7);
  return 1.0 - (auVar2._0_8_ / auVar4._0_8_) / dVar6;
}

Assistant:

double calcScore ( const int * bins, const int bincount, const int keycount )
{
  double n = bincount;
  double k = keycount;

  // compute rms value

  double r = 0;

  for(int i = 0; i < bincount; i++)
  {
    double b = bins[i];

    r += b*b;
  }

  r = sqrt(r / n);

  // compute fill factor

  double f = (k*k - 1) / (n*r*r - k);

  // rescale to (0,1) with 0 = good, 1 = bad

  return 1 - (f / n);
}